

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O0

int h264_macroblock_layer
              (bitstream *str,h264_cabac_context *cabac,h264_slice *slice,h264_macroblock *mb)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long in_RCX;
  h264_macroblock *in_RDX;
  h264_slice *in_RSI;
  h264_cabac_context *in_RDI;
  int infer_cbp;
  int has_chroma;
  int i_1;
  int noSubMbPartSizeLessThan8x8Flag;
  int i;
  h264_seqparm *seqparm;
  h264_picparm *picparm;
  int in_stack_00000058;
  int in_stack_0000005c;
  h264_macroblock *in_stack_00000060;
  h264_slice *in_stack_00000068;
  h264_cabac_context *in_stack_00000070;
  bitstream *in_stack_00000078;
  undefined4 in_stack_ffffffffffffffa8;
  uint32_t in_stack_ffffffffffffffac;
  uint in_stack_ffffffffffffffb0;
  vs_align_byte_mode in_stack_ffffffffffffffb4;
  uint in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc4;
  bitstream *str_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  lVar1 = *(long *)(in_RDX->pcm_sample_luma + 9);
  str_00 = *(bitstream **)(in_RDX->pcm_sample_luma + 7);
  iVar3 = h264_mb_type((bitstream *)picparm,(h264_cabac_context *)seqparm,i,
                       &_has_chroma->mb_field_decoding_flag);
  if (iVar3 != 0) {
    return 1;
  }
  if (*(int *)(in_RCX + 4) == 0x19) {
    iVar3 = vs_align_byte((bitstream *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                          ,in_stack_ffffffffffffffb4);
    if (iVar3 != 0) {
      return 1;
    }
    for (iVar3 = 0; iVar3 < 0x100; iVar3 = iVar3 + 1) {
      iVar4 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                   (uint32_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac);
      if (iVar4 != 0) {
        return 1;
      }
    }
    if (in_RDX->pcm_sample_chroma[0x1fe] != 0) {
      for (iVar3 = 0; iVar3 < 0x40 << ((byte)in_RDX->pcm_sample_chroma[0x1fe] & 0x1f);
          iVar3 = iVar3 + 1) {
        iVar4 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (uint32_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffac);
        if (iVar4 != 0) {
          return 1;
        }
      }
    }
    if ((in_RSI != (h264_slice *)0x0) &&
       (iVar3 = h264_cabac_init_arith
                          ((bitstream *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                           (h264_cabac_context *)0x10ce2f), iVar3 != 0)) {
      return 1;
    }
    iVar3 = vs_infers((bitstream *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                      (int32_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffac);
    if (iVar3 != 0) {
      return 1;
    }
    iVar3 = vs_infer((bitstream *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (uint32_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffac);
    if (iVar3 != 0) {
      return 1;
    }
    iVar3 = vs_infer((bitstream *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (uint32_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffac);
    if (iVar3 != 0) {
      return 1;
    }
    iVar3 = vs_infer((bitstream *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (uint32_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffac);
    if (iVar3 != 0) {
      return 1;
    }
    iVar3 = infer_intra((bitstream *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                        (h264_macroblock *)
                        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffac);
    if (iVar3 != 0) {
      return 1;
    }
    iVar3 = infer_intra((bitstream *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                        (h264_macroblock *)
                        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffac);
    if (iVar3 != 0) {
      return 1;
    }
    for (iVar3 = 0; iVar3 < 0x11; iVar3 = iVar3 + 1) {
      *(undefined4 *)(in_RCX + 0x36a8 + (long)iVar3 * 4) = 1;
      *(undefined4 *)(in_RCX + 0x36ec + (long)iVar3 * 4) = 1;
      *(undefined4 *)(in_RCX + 0x3730 + (long)iVar3 * 4) = 1;
    }
    for (iVar3 = 0; iVar3 < 0x10; iVar3 = iVar3 + 1) {
      *(undefined4 *)(in_RCX + 0x35e8 + (long)iVar3 * 4) = 0x10;
      *(undefined4 *)(in_RCX + 0x3628 + (long)iVar3 * 4) = 0x10;
      *(undefined4 *)(in_RCX + 0x3668 + (long)iVar3 * 4) = 0x10;
    }
  }
  else {
    iVar4 = 1;
    iVar3 = h264_is_submb_mb_type(*(uint32_t *)(in_RCX + 4));
    if (iVar3 == 0) {
      if ((*(int *)(in_RCX + 4) == 0) || (*(int *)(in_RCX + 4) == 0x1a)) {
        if (*(int *)(lVar1 + 0xb8) == 0) {
          iVar3 = vs_infer((bitstream *)
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                           (uint32_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                           ,in_stack_ffffffffffffffac);
          if (iVar3 != 0) {
            return 1;
          }
        }
        else {
          iVar3 = h264_transform_size_8x8_flag
                            (str_00,(h264_cabac_context *)CONCAT44(in_stack_ffffffffffffffc4,iVar4),
                             (uint32_t *)
                             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
          if (iVar3 != 0) {
            return 1;
          }
        }
      }
      iVar3 = h264_mb_pred((bitstream *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                           in_RSI,in_RDX);
      if (iVar3 != 0) {
        return 1;
      }
    }
    else {
      iVar3 = h264_sub_mb_pred((bitstream *)picparm,(h264_cabac_context *)seqparm,
                               (h264_slice *)CONCAT44(i,noSubMbPartSizeLessThan8x8Flag),_has_chroma)
      ;
      if (iVar3 != 0) {
        return 1;
      }
      for (in_stack_ffffffffffffffbc = 0; in_stack_ffffffffffffffbc < 4;
          in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc + 1) {
        if (*(int *)(in_RCX + 0xcb8 + (long)in_stack_ffffffffffffffbc * 4) == 4) {
          if (str_00[0x37].hasbyte == 0) {
            iVar4 = 0;
          }
        }
        else if (sub_mb_part_info[*(uint *)(in_RCX + 0xcb8 + (long)in_stack_ffffffffffffffbc * 4)]
                 [0] != 0) {
          iVar4 = 0;
        }
      }
      iVar3 = vs_infer((bitstream *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       (uint32_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffac);
      if (iVar3 != 0) {
        return 1;
      }
    }
    if (((*(int *)(in_RCX + 4) == 0) || (*(int *)(in_RCX + 4) == 0x1a)) ||
       (0x19 < *(uint *)(in_RCX + 4))) {
      uVar2 = in_stack_ffffffffffffffb0 & 0xffffff;
      if (in_RDX->pcm_sample_chroma[0x1fe] < 3) {
        uVar2 = CONCAT13(in_RDX->pcm_sample_chroma[0x1fe] != 0,(int3)in_stack_ffffffffffffffb0);
      }
      in_stack_ffffffffffffffb0 = uVar2;
      in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb0 >> 0x18;
      iVar3 = h264_coded_block_pattern(str,cabac,slice._4_4_,(int)slice,&mb->mb_field_decoding_flag)
      ;
      if (iVar3 != 0) {
        return 1;
      }
      if (0x19 < *(uint *)(in_RCX + 4)) {
        if ((((*(uint *)(in_RCX + 8) & 0xf) == 0) || (*(int *)(lVar1 + 0xb8) == 0)) ||
           ((iVar4 == 0 || ((*(int *)(in_RCX + 4) == 0x21 && (str_00[0x37].hasbyte == 0)))))) {
          iVar3 = vs_infer((bitstream *)
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                           (uint32_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                           ,in_stack_ffffffffffffffac);
          if (iVar3 != 0) {
            return 1;
          }
        }
        else {
          iVar3 = h264_transform_size_8x8_flag
                            (str_00,(h264_cabac_context *)CONCAT44(in_stack_ffffffffffffffc4,iVar4),
                             (uint32_t *)
                             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
          if (iVar3 != 0) {
            return 1;
          }
        }
      }
    }
    else {
      in_stack_ffffffffffffffb4 = (*(int *)(in_RCX + 4) - 1U >> 2) % 3 << 4;
      if (0xc < *(uint *)(in_RCX + 4)) {
        in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 | 0xf;
      }
      iVar3 = vs_infer((bitstream *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       (uint32_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffac);
      if (iVar3 != 0) {
        return 1;
      }
      iVar3 = vs_infer((bitstream *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       (uint32_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffac);
      if (iVar3 != 0) {
        return 1;
      }
    }
    if ((*(int *)(in_RCX + 8) == 0) &&
       (iVar3 = h264_is_intra_16x16_mb_type(*(uint32_t *)(in_RCX + 4)), iVar3 == 0)) {
      iVar3 = vs_infers((bitstream *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                        (int32_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffac);
      if (iVar3 != 0) {
        return 1;
      }
    }
    else {
      iVar3 = h264_mb_qp_delta(str_00,(h264_cabac_context *)
                                      CONCAT44(in_stack_ffffffffffffffc4,iVar4),
                               (int32_t *)
                               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      if (iVar3 != 0) {
        return 1;
      }
    }
    iVar3 = h264_residual(in_stack_00000078,in_stack_00000070,in_stack_00000068,in_stack_00000060,
                          in_stack_0000005c,in_stack_00000058);
    if (iVar3 != 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int h264_macroblock_layer(struct bitstream *str, struct h264_cabac_context *cabac, struct h264_slice *slice, struct h264_macroblock *mb) {
	struct h264_picparm *picparm = slice->picparm;
	struct h264_seqparm *seqparm = slice->seqparm;
	if (h264_mb_type(str, cabac, slice->slice_type, &mb->mb_type)) return 1;
	if (mb->mb_type == H264_MB_TYPE_I_PCM) {
		if (vs_align_byte(str, VS_ALIGN_0)) return 1;
		int i;
		for (i = 0; i < 256; i++)
			if (vs_u(str, &mb->pcm_sample_luma[i], slice->bit_depth_luma_minus8 + 8)) return 1;
		if (slice->chroma_array_type) {
			for (i = 0; i < (64 << slice->chroma_array_type); i++)
				if (vs_u(str, &mb->pcm_sample_chroma[i], slice->bit_depth_chroma_minus8 + 8)) return 1;
		}
		if (cabac)
			if (h264_cabac_init_arith(str, cabac)) return 1;
		if (vs_infers(str, &mb->mb_qp_delta, 0)) return 1;
		if (vs_infer(str, &mb->transform_size_8x8_flag, 0)) return 1;
		if (vs_infer(str, &mb->coded_block_pattern, 0x2f)) return 1;
		if (vs_infer(str, &mb->intra_chroma_pred_mode, 0)) return 1;
		if (infer_intra(str, mb, 0)) return 1;
		if (infer_intra(str, mb, 1)) return 1;
		for (i = 0; i < 17; i++) {
			mb->coded_block_flag[0][i] = 1;
			mb->coded_block_flag[1][i] = 1;
			mb->coded_block_flag[2][i] = 1;
		}
		for (i = 0; i < 16; i++) {
			mb->total_coeff[0][i] = 16;
			mb->total_coeff[1][i] = 16;
			mb->total_coeff[2][i] = 16;
		}
	} else {
		int noSubMbPartSizeLessThan8x8Flag = 1;
		if (h264_is_submb_mb_type(mb->mb_type)) {
			if (h264_sub_mb_pred(str, cabac, slice, mb)) return 1;
			int i;
			for (i = 0; i < 4; i++) {
				if (mb->sub_mb_type[i] != H264_SUB_MB_TYPE_B_DIRECT_8X8) {
					if (sub_mb_part_info[mb->sub_mb_type[i]][0])
						noSubMbPartSizeLessThan8x8Flag = 0;
				} else {
					if (!seqparm->direct_8x8_inference_flag)
						noSubMbPartSizeLessThan8x8Flag = 0;
				}
			}
			if (vs_infer(str, &mb->intra_chroma_pred_mode, 0)) return 1;
		} else {
			if (mb->mb_type == H264_MB_TYPE_I_NXN || mb->mb_type == H264_MB_TYPE_SI) {
				if (picparm->transform_8x8_mode_flag) {
					if (h264_transform_size_8x8_flag(str, cabac, &mb->transform_size_8x8_flag)) return 1;
				} else {
					if (vs_infer(str, &mb->transform_size_8x8_flag, 0)) return 1;
				}
			}
			if (h264_mb_pred(str, cabac, slice, mb)) return 1;
		}
		if (mb->mb_type == H264_MB_TYPE_I_NXN || mb->mb_type == H264_MB_TYPE_SI || mb->mb_type >= H264_MB_TYPE_I_END) {
			int has_chroma = slice->chroma_array_type < 3 && slice->chroma_array_type != 0;
			if (h264_coded_block_pattern(str, cabac, mb->mb_type, has_chroma, &mb->coded_block_pattern)) return 1;
			if (mb->mb_type >= H264_MB_TYPE_I_END) {
				if ((mb->coded_block_pattern & 0xf) && picparm->transform_8x8_mode_flag && noSubMbPartSizeLessThan8x8Flag && (mb->mb_type != H264_MB_TYPE_B_DIRECT_16X16 || seqparm->direct_8x8_inference_flag)) {
					if (h264_transform_size_8x8_flag(str, cabac, &mb->transform_size_8x8_flag)) return 1;
				} else {
					if (vs_infer(str, &mb->transform_size_8x8_flag, 0)) return 1;
				}
			}
		} else {
			int infer_cbp = (((mb->mb_type - H264_MB_TYPE_I_16X16_0_0_0) >> 2) % 3) << 4;
			if (mb->mb_type >= H264_MB_TYPE_I_16X16_0_0_1)
				infer_cbp |= 0xf;
			if (vs_infer(str, &mb->coded_block_pattern, infer_cbp)) return 1;
			if (vs_infer(str, &mb->transform_size_8x8_flag, 0)) return 1;
		}
		if (mb->coded_block_pattern || h264_is_intra_16x16_mb_type(mb->mb_type)) {
			if (h264_mb_qp_delta(str, cabac, &mb->mb_qp_delta)) return 1;
		} else {
			if (vs_infers(str, &mb->mb_qp_delta, 0)) return 1;
		}
		if (h264_residual(str, cabac, slice, mb, 0, 15)) return 1;
	}
	return 0;
}